

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O0

int Mpm_CutGetArea(Mpm_Man_t *p,Mpm_Cut_t *pCut)

{
  Mpm_Dsd_t *pMVar1;
  int iVar2;
  Mpm_Cut_t *pCut_local;
  Mpm_Man_t *p_local;
  
  if (p->pPars->fMap4Cnf == 0) {
    if (p->pPars->fMap4Aig == 0) {
      if (p->pPars->fMap4Gates == 0) {
        p_local._4_4_ = p->pLibLut->pLutAreas[*(uint *)&pCut->field_0x4 >> 0x1b];
      }
      else {
        p_local._4_4_ = 0x14;
      }
    }
    else {
      pMVar1 = p->pDsd6;
      iVar2 = Abc_Lit2Var(*(uint *)&pCut->field_0x4 & 0x1ffffff);
      p_local._4_4_ = pMVar1[iVar2].nAnds * 0x14;
    }
  }
  else {
    pMVar1 = p->pDsd6;
    iVar2 = Abc_Lit2Var(*(uint *)&pCut->field_0x4 & 0x1ffffff);
    p_local._4_4_ = pMVar1[iVar2].nClauses * 0x14;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Mpm_CutGetArea( Mpm_Man_t * p, Mpm_Cut_t * pCut )  
{
    if ( p->pPars->fMap4Cnf )
        return MPM_UNIT_AREA * p->pDsd6[Abc_Lit2Var(pCut->iFunc)].nClauses;
    if ( p->pPars->fMap4Aig )
        return MPM_UNIT_AREA * p->pDsd6[Abc_Lit2Var(pCut->iFunc)].nAnds;
    if ( p->pPars->fMap4Gates )
        return MPM_UNIT_AREA * 1;
    return p->pLibLut->pLutAreas[pCut->nLeaves];
}